

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::added2Set(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,
           SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *addset,int n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint *puVar3;
  int iVar4;
  Item *pIVar5;
  DataKey *pDVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  int iVar19;
  DataArray<int> moreArray;
  int *local_40;
  undefined8 local_38;
  
  if (n != 0) {
    iVar4 = (set->set).thenum;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    iVar19 = 0;
    iVar13 = iVar4;
    if (iVar4 < 1) {
      iVar13 = 0;
    }
    iVar15 = 1;
    if (0 < iVar4) {
      iVar15 = iVar13;
    }
    spx_alloc<int*>(&local_40,iVar15);
    piVar12 = local_40;
    lVar14 = (long)(set->set).thenum;
    if (0 < lVar14) {
      memset(local_40,0,lVar14 << 2);
    }
    if (0 < n) {
      iVar4 = (addset->set).thenum;
      pIVar5 = (addset->set).theitem;
      pDVar6 = (addset->set).thekey;
      lVar14 = (long)(iVar4 - n);
      iVar19 = 0;
      do {
        iVar13 = pDVar6[lVar14].idx;
        iVar15 = pIVar5[iVar13].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        lVar16 = (long)iVar15;
        if (0 < lVar16) {
          lVar17 = lVar16 + 1;
          piVar18 = &pIVar5[iVar13].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem[lVar16 + -1].idx;
          do {
            piVar12[*piVar18] = piVar12[*piVar18] + 1;
            lVar17 = lVar17 + -1;
            piVar18 = piVar18 + -0xf;
          } while (1 < lVar17);
        }
        iVar19 = iVar19 + iVar15;
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar4);
    }
    if ((set->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ).themax < iVar19) {
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::memRemax(set,iVar19);
    }
    lVar14 = (long)(set->set).thenum;
    if (0 < lVar14) {
      lVar14 = lVar14 + 1;
      do {
        pIVar5 = (set->set).theitem + (set->set).thekey[lVar14 + -2].idx;
        iVar4 = (pIVar5->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend(set,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar5,piVar12[lVar14 + -2] + iVar4);
        (set->set).theitem[(set->set).thekey[lVar14 + -2].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = piVar12[lVar14 + -2] + iVar4;
        piVar12[lVar14 + -2] = iVar4;
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    if (0 < n) {
      lVar14 = (long)((addset->set).thenum - n);
      do {
        pIVar5 = (addset->set).theitem;
        iVar4 = (addset->set).thekey[lVar14].idx;
        lVar16 = (long)pIVar5[iVar4].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar16) {
          lVar17 = lVar16 + 1;
          lVar16 = lVar16 * 0x3c + -4;
          do {
            pNVar7 = pIVar5[iVar4].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            iVar13 = *(int *)((long)&(pNVar7->val).m_backend.data + lVar16);
            iVar19 = piVar12[iVar13];
            piVar12[iVar13] = iVar19 + 1;
            pNVar8 = (set->set).theitem[(set->set).thekey[iVar13].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar8[iVar19].idx = (int)lVar14;
            puVar1 = (undefined8 *)((long)(&pNVar7->val + -1) + lVar16);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar16 + -0x28);
            uVar10 = *puVar2;
            uVar11 = puVar2[1];
            *(undefined8 *)&pNVar8[iVar19].val.m_backend.data = *puVar1;
            *(undefined8 *)((long)&pNVar8[iVar19].val.m_backend.data + 8) = uVar9;
            puVar3 = (uint *)((long)&pNVar8[iVar19].val.m_backend.data + 0x10);
            *(undefined8 *)puVar3 = uVar10;
            *(undefined8 *)(puVar3 + 2) = uVar11;
            *(undefined8 *)((long)&pNVar8[iVar19].val.m_backend.data + 0x20) =
                 *(undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar16 + -0x18);
            pNVar8[iVar19].val.m_backend.exp =
                 *(int *)((long)&(pNVar7->val).m_backend.data + lVar16 + -0x10);
            pNVar8[iVar19].val.m_backend.neg =
                 *(bool *)((long)&(pNVar7->val).m_backend.data + lVar16 + -0xc);
            uVar9 = *(undefined8 *)((long)&(pNVar7->val).m_backend.data + lVar16 + -8);
            pNVar8[iVar19].val.m_backend.fpclass = (int)uVar9;
            pNVar8[iVar19].val.m_backend.prec_elem = (int)((ulong)uVar9 >> 0x20);
            lVar17 = lVar17 + -1;
            lVar16 = lVar16 + -0x3c;
          } while (1 < lVar17);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (addset->set).thenum);
    }
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }